

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O0

void __thiscall QPicture::QPicture(QPicture *this,int formatVersion)

{
  QPicturePrivate *pQVar1;
  int in_ESI;
  QPaintDevice *in_RDI;
  long in_FS_OFFSET;
  QPicturePrivate *d;
  QPicturePrivate *data;
  int line;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(in_RDI);
  in_RDI->_vptr_QPaintDevice = (_func_int **)&PTR__QPicture_00e14c10;
  data = (QPicturePrivate *)(in_RDI + 1);
  pQVar1 = (QPicturePrivate *)operator_new(0xb8);
  QPicturePrivate::QPicturePrivate(pQVar1);
  QExplicitlySharedDataPointer<QPicturePrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QPicturePrivate> *)pQVar1,data);
  line = (int)((ulong)pQVar1 >> 0x20);
  pQVar1 = d_func((QPicture *)0x319868);
  if (in_ESI == 0) {
    QMessageLogger::QMessageLogger((QMessageLogger *)pQVar1,(char *)in_RDI,line,(char *)data);
    QMessageLogger::warning(local_28,"QPicture: invalid format version 0");
  }
  if ((in_ESI < 1) || (in_ESI == 0x17)) {
    QPicturePrivate::resetFormat(pQVar1);
  }
  else {
    pQVar1->formatMajor = in_ESI;
    pQVar1->formatMinor = 0;
    pQVar1->formatOk = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPicture::QPicture(int formatVersion)
    : QPaintDevice(),
      d_ptr(new QPicturePrivate)
{
    Q_D(QPicture);

    if (formatVersion == 0)
        qWarning("QPicture: invalid format version 0");

    // still accept the 0 default from before Qt 3.0.
    if (formatVersion > 0 && formatVersion != (int)mfhdr_maj) {
        d->formatMajor = formatVersion;
        d->formatMinor = 0;
        d->formatOk = false;
    } else {
        d->resetFormat();
    }
}